

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O1

__normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
 __thiscall
gmlc::containers::
DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>::
find(DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
     *this,GlobalFederateId *searchValue)

{
  __node_base_ptr p_Var1;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  _Var2;
  _Hash_node_base *p_Var3;
  
  p_Var3 = (_Hash_node_base *)0x0;
  p_Var1 = std::
           _Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     ((_Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&this->lookup2,
                      (ulong)(long)searchValue->gid % (this->lookup2)._M_h._M_bucket_count,
                      searchValue,(long)searchValue->gid);
  if (p_Var1 != (__node_base_ptr)0x0) {
    p_Var3 = p_Var1->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    _Var2._M_current =
         (this->dataStorage).
         super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    _Var2._M_current =
         (this->dataStorage).
         super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
         super__Vector_impl_data._M_start + (long)p_Var3[2]._M_nxt;
  }
  return (__normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
          )_Var2._M_current;
}

Assistant:

auto find(const searchType2& searchValue)
        {
            auto fnd = lookup2.find(searchValue);
            if (fnd != lookup2.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }